

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_api.c
# Opt level: O1

char * module_file_base(char *module,char sep)

{
  char *__s;
  size_t sVar1;
  ulong uVar2;
  
  __s = (*ecs_os_api.strdup_)(module);
  sVar1 = strlen(__s);
  if (0 < (int)(uint)sVar1) {
    uVar2 = 0;
    do {
      if (__s[uVar2] == '.') {
        __s[uVar2] = sep;
      }
      uVar2 = uVar2 + 1;
    } while (((uint)sVar1 & 0x7fffffff) != uVar2);
  }
  return __s;
}

Assistant:

static
char *module_file_base(const char *module, char sep) {
    char *base = ecs_os_strdup(module);
    ecs_size_t i, len = ecs_os_strlen(base);
    for (i = 0; i < len; i ++) {
        if (base[i] == '.') {
            base[i] = sep;
        }
    }

    return base;
}